

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               ImGuiSliderFlags flags)

{
  ImGuiInputSource IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined1 is_logarithmic;
  ImGuiSliderFlags IVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float local_78;
  float local_68;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar5 = data_type & 0xfffffffe;
  IVar1 = GImGui->ActiveIdSource;
  uVar8 = (ulong)((flags & 0x100000U) >> 0x14);
  IVar6 = flags;
  if (IVar1 == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    if (!bVar3) {
LAB_0015f56a:
      IVar1 = pIVar2->ActiveIdSource;
      goto LAB_0015f575;
    }
    bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5);
    is_logarithmic = (undefined1)IVar6;
    if (!bVar3) goto LAB_0015f56a;
    fVar10 = (float)(pIVar2->IO).KeyMap[uVar8 - 2];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar10 = fVar10 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar10 = fVar10 * 10.0;
    }
  }
  else {
LAB_0015f575:
    is_logarithmic = (undefined1)IVar6;
    fVar10 = 0.0;
    if (IVar1 == ImGuiInputSource_Nav) {
      iVar7 = 0;
      if (uVar5 == 8) {
        iVar7 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar10 = (&local_38.x)[uVar8];
      fVar9 = GetMinimumStepAtDecimalPrecision(iVar7);
      v_speed = (float)((uint)v_speed & -(uint)(fVar9 <= v_speed) |
                       ~-(uint)(fVar9 <= v_speed) & (uint)fVar9);
    }
  }
  fVar10 = fVar10 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar10 = -fVar10;
  }
  if (((flags & 0x20U) != 0) && (v_max - v_min != 0 && v_min <= v_max)) {
    fVar10 = fVar10 / (float)(v_max - v_min);
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar10)) goto LAB_0015f682;
    bVar3 = fVar10 < 0.0 && *v <= v_min;
  }
  else {
    bVar3 = false;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && (!bVar3)) {
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar10;
      pIVar2->DragCurrentAccumDirty = true;
    }
    else if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    iVar7 = *v;
    if ((flags & 0x20U) == 0) {
      iVar7 = iVar7 + (int)pIVar2->DragCurrentAccum;
      local_78 = 0.0;
      local_68 = 0.0;
    }
    else {
      if (uVar5 == 8) {
        iVar4 = ImParseFormatPrecision(format,3);
        fVar9 = (float)iVar4;
      }
      else {
        fVar9 = 1.0;
      }
      local_68 = powf(0.1,fVar9);
      local_78 = ScaleRatioFromValueT<int,int,float>
                           ((ImGui *)(ulong)(uint)data_type,iVar7,v_min,v_max,1,(bool)is_logarithmic
                            ,local_68,0.0);
      iVar7 = ScaleValueFromRatioT<int,int,float>
                        (data_type,local_78 + pIVar2->DragCurrentAccum,v_min,v_max,true,local_68,0.0
                        );
    }
    if ((flags & 0x40U) == 0) {
      iVar7 = RoundScalarWithFormatT<int,int>(format,data_type,iVar7);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      iVar4 = *v;
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(iVar7 - iVar4);
    }
    else {
      fVar9 = ScaleRatioFromValueT<int,int,float>
                        ((ImGui *)(ulong)(uint)data_type,iVar7,v_min,v_max,1,(bool)is_logarithmic,
                         local_68,0.0);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar9 - local_78);
      iVar4 = *v;
    }
    if ((v_min < v_max) && (iVar4 != iVar7)) {
      if ((iVar7 < v_min) || (((uVar5 != 8 && (iVar4 < iVar7)) && (fVar10 < 0.0)))) {
        iVar7 = v_min;
      }
      if ((v_max < iVar7) || (((uVar5 != 8 && (iVar7 < iVar4)) && (0.0 < fVar10)))) {
        iVar7 = v_max;
      }
    }
    if (iVar4 == iVar7) {
      return false;
    }
    *v = iVar7;
    return true;
  }
LAB_0015f682:
  pIVar2->DragCurrentAccum = 0.0;
  pIVar2->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}